

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse_time.c
# Opt level: O3

time_t ngx_parse_http_time(u_char *value,size_t len)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  byte *pbVar6;
  time_t tVar7;
  int iVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint local_40;
  
  pbVar1 = value + len;
  if (0 < (long)len) {
    do {
      if (*value == 0x20) {
        bVar5 = true;
        goto LAB_001189ba;
      }
    } while ((*value != 0x2c) && (value = value + 1, value < pbVar1));
  }
  bVar5 = false;
LAB_001189ba:
  uVar12 = 0;
  do {
    uVar11 = uVar12;
    pbVar6 = value + uVar11 + 1;
    if (pbVar1 <= pbVar6) break;
    uVar12 = uVar11 + 1;
  } while (*pbVar6 == 0x20);
  tVar7 = -1;
  if ((long)(pbVar1 + (~uVar11 - (long)value)) < 0x12) {
    return -1;
  }
  if (bVar5) {
    iVar8 = 3;
    uVar12 = 0x20;
  }
  else {
    bVar2 = *pbVar6;
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
      return -1;
    }
    if ((byte)(value[uVar11 + 2] - 0x3a) < 0xf6) {
      return -1;
    }
    if (value[uVar11 + 3] == 0x2d) {
      iVar8 = 2;
    }
    else {
      if (value[uVar11 + 3] != 0x20) {
        return -1;
      }
      iVar8 = 1;
      if ((long)(pbVar1 + (-uVar11 - (long)value) + -3) < 0x12) {
        return -1;
      }
    }
    uVar12 = (ulong)((uint)value[uVar11 + 2] + ((uint)bVar2 + (uint)bVar2 * 4) * 2 + -0x210);
    pbVar6 = value + uVar11 + 4;
  }
  switch(*pbVar6) {
  case 0x41:
    uVar11 = (ulong)(pbVar6[1] != 0x70) * 4 + 3;
    break;
  default:
    goto switchD_00118a27_caseD_42;
  case 0x44:
    uVar11 = 0xb;
    break;
  case 0x46:
    uVar11 = 1;
    break;
  case 0x4a:
    if (pbVar6[1] == 0x61) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)(pbVar6[2] != 0x6e) + 5;
    }
    break;
  case 0x4d:
    uVar11 = (ulong)(pbVar6[2] != 0x72) * 2 + 2;
    break;
  case 0x4e:
    uVar11 = 10;
    break;
  case 0x4f:
    uVar11 = 9;
    break;
  case 0x53:
    uVar11 = 8;
  }
  if (iVar8 == 2) {
    if (pbVar6[3] != 0x2d) {
      return -1;
    }
    bVar2 = pbVar6[4];
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
      return -1;
    }
    if ((byte)(pbVar6[5] - 0x3a) < 0xf6) {
      return -1;
    }
    uVar13 = (uint)pbVar6[5] + ((uint)bVar2 + (uint)bVar2 * 4) * 2 + -0x210;
    uVar10 = (ulong)uVar13 + 0x76c;
    if (uVar13 < 0x46) {
      uVar10 = (ulong)uVar13 + 2000;
    }
    pbVar6 = pbVar6 + 6;
LAB_00118bcb:
    bVar5 = false;
  }
  else {
    if (iVar8 == 1) {
      if (pbVar6[3] != 0x20) {
        return -1;
      }
      if ((byte)(pbVar6[4] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar6[5] - 0x3a) < 0xf6) {
        return -1;
      }
      bVar2 = pbVar6[6];
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar6[7] - 0x3a) < 0xf6) {
        return -1;
      }
      uVar10 = (ulong)(((uint)pbVar6[7] +
                       (uint)pbVar6[5] * 100 + (uint)pbVar6[4] * 1000 +
                       ((uint)bVar2 + (uint)bVar2 * 4) * 2) - 0xd050);
      pbVar6 = pbVar6 + 8;
      goto LAB_00118bcb;
    }
    pbVar9 = pbVar6 + 4;
    if (pbVar6[4] == 0x20) {
      pbVar9 = pbVar6 + 5;
    }
    if ((byte)(pbVar6[(ulong)(pbVar6[4] == 0x20) + 4] - 0x3a) < 0xf6) {
      return -1;
    }
    uVar12 = (ulong)(pbVar6[(ulong)(pbVar6[4] == 0x20) + 4] & 0xf);
    bVar2 = pbVar9[1];
    if ((ulong)bVar2 == 0x20) {
      pbVar6 = pbVar9 + 1;
    }
    else {
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
        return -1;
      }
      pbVar6 = pbVar9 + 2;
      uVar12 = ((ulong)bVar2 + uVar12 * 10) - 0x30;
    }
    if ((long)pbVar1 - (long)pbVar6 < 0xe) {
      return -1;
    }
    uVar10 = 0x7f6;
    bVar5 = true;
  }
  if ((((((*pbVar6 == 0x20) && (bVar2 = pbVar6[1], 0xf5 < (byte)(bVar2 - 0x3a))) &&
        (0xf5 < (byte)(pbVar6[2] - 0x3a))) &&
       ((pbVar6[3] == 0x3a && (bVar3 = pbVar6[4], 0xf5 < (byte)(bVar3 - 0x3a))))) &&
      ((0xf5 < (byte)(pbVar6[5] - 0x3a) &&
       ((pbVar6[6] == 0x3a && (bVar4 = pbVar6[7], 0xf5 < (byte)(bVar4 - 0x3a))))))) &&
     (0xf5 < (byte)(pbVar6[8] - 0x3a))) {
    if (bVar5) {
      if (pbVar6[9] != 0x20) {
        return -1;
      }
      if ((byte)(pbVar6[10] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar6[0xb] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar6[0xc] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar6[0xd] - 0x3a) < 0xf6) {
        return -1;
      }
      local_40 = (uint)pbVar6[0xb];
      uVar10 = (ulong)(((uint)pbVar6[10] * 1000 + local_40 * 100 + (uint)pbVar6[0xc] * 10 +
                       (uint)pbVar6[0xd]) - 0xd050);
    }
    uVar13 = (uint)pbVar6[2] + ((uint)bVar2 + (uint)bVar2 * 4) * 2 + -0x210;
    if (((uVar13 < 0x18) &&
        (uVar14 = (uint)pbVar6[5] + ((uint)bVar3 + (uint)bVar3 * 4) * 2 + -0x210, uVar14 < 0x3c)) &&
       (uVar15 = (uint)pbVar6[8] + ((uint)bVar4 + (uint)bVar4 * 4) * 2 + -0x210, uVar15 < 0x3c)) {
      if ((uVar12 == 0x1d) && ((int)uVar11 == 1)) {
        if ((uVar10 & 3) != 0) {
          return -1;
        }
        if (((uVar10 * -0x70a3d70a3d70a3d7 >> 2 | uVar10 * -0x70a3d70a3d70a3d7 << 0x3e) <
             0x28f5c28f5c28f5d) && (uVar10 != (uVar10 / 400) * 400)) {
          return -1;
        }
      }
      else if (mday[uVar11] < uVar12) {
        return -1;
      }
      uVar10 = uVar10 - (uVar11 < 2);
      tVar7 = (ulong)uVar14 * 0x3c + (ulong)uVar13 * 0xe10 + (ulong)uVar15 + -0xe794e4080 +
              (((((((ulong)(uVar11 < 2) - 1 | 0xb) + uVar11) * 0x16f) / 0xc + uVar12 + (uVar10 >> 2)
                + uVar10 * 0x16d) - (uVar10 >> 2) / 0x19) + uVar10 / 400) * 0x15180;
    }
  }
switchD_00118a27_caseD_42:
  return tVar7;
}

Assistant:

time_t
ngx_parse_http_time(u_char *value, size_t len)
{
    u_char      *p, *end;
    ngx_int_t    month;
    ngx_uint_t   day, year, hour, min, sec;
    uint64_t     time;
    enum {
        no = 0,
        rfc822,   /* Tue, 10 Nov 2002 23:50:13   */
        rfc850,   /* Tuesday, 10-Dec-02 23:50:13 */
        isoc      /* Tue Dec 10 23:50:13 2002    */
    } fmt;

    fmt = 0;
    end = value + len;

#if (NGX_SUPPRESS_WARN)
    day = 32;
    year = 2038;
#endif

    for (p = value; p < end; p++) {
        if (*p == ',') {
            break;
        }

        if (*p == ' ') {
            fmt = isoc;
            break;
        }
    }

    for (p++; p < end; p++)
        if (*p != ' ') {
            break;
        }

    if (end - p < 18) {
        return NGX_ERROR;
        }

    if (fmt != isoc) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
            return NGX_ERROR;
        }

        day = (*p - '0') * 10 + *(p + 1) - '0';
        p += 2;

        if (*p == ' ') {
            if (end - p < 18) {
                return NGX_ERROR;
            }
            fmt = rfc822;

        } else if (*p == '-') {
            fmt = rfc850;

        } else {
            return NGX_ERROR;
        }

        p++;
    }

    switch (*p) {

    case 'J':
        month = *(p + 1) == 'a' ? 0 : *(p + 2) == 'n' ? 5 : 6;
        break;

    case 'F':
        month = 1;
        break;

    case 'M':
        month = *(p + 2) == 'r' ? 2 : 4;
        break;

    case 'A':
        month = *(p + 1) == 'p' ? 3 : 7;
        break;

    case 'S':
        month = 8;
        break;

    case 'O':
        month = 9;
        break;

    case 'N':
        month = 10;
        break;

    case 'D':
        month = 11;
        break;

    default:
        return NGX_ERROR;
    }

    p += 3;

    if ((fmt == rfc822 && *p != ' ') || (fmt == rfc850 && *p != '-')) {
        return NGX_ERROR;
    }

    p++;

    if (fmt == rfc822) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9'
            || *(p + 2) < '0' || *(p + 2) > '9'
            || *(p + 3) < '0' || *(p + 3) > '9')
        {
            return NGX_ERROR;
        }

        year = (*p - '0') * 1000 + (*(p + 1) - '0') * 100
               + (*(p + 2) - '0') * 10 + *(p + 3) - '0';
        p += 4;

    } else if (fmt == rfc850) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
            return NGX_ERROR;
        }

        year = (*p - '0') * 10 + *(p + 1) - '0';
        year += (year < 70) ? 2000 : 1900;
        p += 2;
    }

    if (fmt == isoc) {
        if (*p == ' ') {
            p++;
        }

        if (*p < '0' || *p > '9') {
            return NGX_ERROR;
        }

        day = *p++ - '0';

        if (*p != ' ') {
            if (*p < '0' || *p > '9') {
                return NGX_ERROR;
            }

            day = day * 10 + *p++ - '0';
        }

        if (end - p < 14) {
            return NGX_ERROR;
        }
    }

    if (*p++ != ' ') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    hour = (*p - '0') * 10 + *(p + 1) - '0';
    p += 2;

    if (*p++ != ':') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    min = (*p - '0') * 10 + *(p + 1) - '0';
    p += 2;

    if (*p++ != ':') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    sec = (*p - '0') * 10 + *(p + 1) - '0';

    if (fmt == isoc) {
        p += 2;

        if (*p++ != ' ') {
            return NGX_ERROR;
        }

        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9'
            || *(p + 2) < '0' || *(p + 2) > '9'
            || *(p + 3) < '0' || *(p + 3) > '9')
        {
            return NGX_ERROR;
        }

        year = (*p - '0') * 1000 + (*(p + 1) - '0') * 100
               + (*(p + 2) - '0') * 10 + *(p + 3) - '0';
    }

    if (hour > 23 || min > 59 || sec > 59) {
        return NGX_ERROR;
    }

    if (day == 29 && month == 1) {
        if ((year & 3) || ((year % 100 == 0) && (year % 400) != 0)) {
            return NGX_ERROR;
        }

    } else if (day > mday[month]) {
        return NGX_ERROR;
    }

    /*
     * shift new year to March 1 and start months from 1 (not 0),
     * it is needed for Gauss' formula
     */

    if (--month <= 0) {
        month += 12;
        year -= 1;
    }

    /* Gauss' formula for Gregorian days since March 1, 1 BC */

    time = (uint64_t) (
            /* days in years including leap years since March 1, 1 BC */

            365 * year + year / 4 - year / 100 + year / 400

            /* days before the month */

            + 367 * month / 12 - 30

            /* days before the day */

            + day - 1

            /*
             * 719527 days were between March 1, 1 BC and March 1, 1970,
             * 31 and 28 days were in January and February 1970
             */

            - 719527 + 31 + 28) * 86400 + hour * 3600 + min * 60 + sec;

#if (NGX_TIME_T_SIZE <= 4)

    if (time > 0x7fffffff) {
        return NGX_ERROR;
    }

#endif

    return (time_t) time;
}